

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O2

socket_t net_listen(char *ip,int port)

{
  int fd;
  int iVar1;
  int iVar2;
  sockaddr local_20;
  
  local_20.sa_data[6] = '\0';
  local_20.sa_data[7] = '\0';
  local_20.sa_data[8] = '\0';
  local_20.sa_data[9] = '\0';
  local_20.sa_data[10] = '\0';
  local_20.sa_data[0xb] = '\0';
  local_20.sa_data[0xc] = '\0';
  local_20.sa_data[0xd] = '\0';
  local_20.sa_family = 2;
  local_20.sa_data._2_4_ = inet_addr(ip);
  local_20.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  fd = socket(2,1,0);
  iVar1 = -1;
  if (-1 < fd) {
    set_no_block(fd);
    set_reuse_addr(fd);
    iVar1 = bind(fd,&local_20,0x10);
    if ((iVar1 < 0) || (iVar2 = listen(fd,5), iVar1 = fd, iVar2 < 0)) {
      close(fd);
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

socket_t net_listen(const char* ip, int port)
{
    sockaddr_in addr;
    int len = sizeof (struct sockaddr_in);
    memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_addr.s_addr = inet_addr(ip);
    addr.sin_port = htons(port);
    
    socket_t fd = ::socket(AF_INET, SOCK_STREAM, 0);
    if (fd < 0) 
    {
        return -1;
    }

    set_no_block(fd);
    set_reuse_addr(fd);

    if (::bind(fd, (struct sockaddr*)&addr, len) < 0) 
    {
        close_socket(fd);
        return -1;
    }

    if (::listen(fd, 5) < 0) 
    {
        close_socket(fd);
        return -1;
    }

    return fd;
}